

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  byte bVar1;
  int iVar2;
  MElementType MVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  TPZConnect *this_00;
  TPZGeoNode *this_01;
  long *plVar7;
  long lVar8;
  int *piVar9;
  double *pdVar10;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long *in_RDI;
  _func_int **pp_Var11;
  int d;
  int i;
  int nshape;
  int kfirst;
  int ifirst;
  int side_1;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  int dim;
  TPZGeoElSide gelside;
  REAL detjac;
  int localside;
  int ls;
  TPZManVector<long,_28> FirstIndex;
  int ncs;
  TPZFNMatrix<50,_double> dphiloc;
  TPZFNMatrix<50,_double> philoc;
  int sidedimension;
  TPZManVector<int,_9> ord;
  MElementType sidetype;
  int transformid;
  TPZManVector<int,_9> permutegather;
  int locid;
  int ic_1;
  TPZManVector<long,_8> id;
  int nsn;
  TPZGeoEl *gel;
  int ic;
  int is;
  int order;
  int connectlocid;
  int nsideshape;
  int ncontained;
  TPZFMatrix<double> *in_stack_fffffffffffff568;
  TPZManVector<long,_28> *in_stack_fffffffffffff570;
  TPZGeoEl *in_stack_fffffffffffff578;
  TPZGeoEl *in_stack_fffffffffffff580;
  TPZVec<double> *in_stack_fffffffffffff588;
  TPZFNMatrix<50,_double> *in_stack_fffffffffffff590;
  TPZVec<long> *in_stack_fffffffffffff598;
  TPZManVector<long,_28> *in_stack_fffffffffffff5a0;
  TPZVec<long> *in_stack_fffffffffffff5d8;
  int local_9b0;
  int local_9ac;
  int local_99c;
  double local_6d8;
  int local_6cc;
  TPZVec<long> local_6c0 [2];
  size_t in_stack_fffffffffffff988;
  char *in_stack_fffffffffffff990;
  TPZVec<int> local_110 [2];
  int local_b8;
  int local_b4;
  TPZVec<long> local_b0 [3];
  int local_4c;
  TPZGeoEl *local_48;
  int local_40;
  int local_3c;
  uint local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int local_c;
  
  local_c = in_ESI;
  if ((in_ESI == 9) || (iVar6 = TPZVec<double>::size(in_RDX), iVar6 != 1)) {
    std::operator<<((ostream *)&std::cout,"Don\'t have side shape associated to this side");
    pzinternal::DebugStopImpl(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  }
  iVar2 = pztopology::TPZQuadrilateral::SideDimension(0x1a0760f);
  if (iVar2 == 1) {
    local_2c = pztopology::TPZQuadrilateral::NContainedSides(0x1a07628);
    local_30 = 0;
    local_34 = (**(code **)(*in_RDI + 0x250))(in_RDI,0,local_c);
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_34);
    bVar1 = TPZConnect::Order(this_00);
    local_38 = (uint)bVar1;
    for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
      local_40 = pztopology::TPZQuadrilateral::ContainedSideLocId
                           ((int)in_stack_fffffffffffff570,
                            (int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      iVar2 = pzshape::TPZShapeQuad::NConnectShapeF
                        ((int)in_stack_fffffffffffff570,
                         (int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      local_30 = iVar2 + local_30;
    }
    local_48 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff578);
    local_4c = pztopology::TPZQuadrilateral::NSideNodes(local_c);
    TPZManVector<long,_8>::TPZManVector
              ((TPZManVector<long,_8> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588
              );
    for (local_b4 = 0; local_b4 < local_4c; local_b4 = local_b4 + 1) {
      local_b8 = pztopology::TPZQuadrilateral::SideNodeLocId
                           ((int)in_stack_fffffffffffff570,
                            (int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      this_01 = TPZGeoEl::Node(in_stack_fffffffffffff580,
                               (int)((ulong)in_stack_fffffffffffff578 >> 0x20));
      iVar2 = TPZGeoNode::Id(this_01);
      plVar7 = TPZVec<long>::operator[](local_b0,(long)local_b4);
      *plVar7 = (long)iVar2;
    }
    TPZManVector<int,_9>::TPZManVector
              ((TPZManVector<int,_9> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588)
    ;
    MVar3 = pztopology::TPZQuadrilateral::Type(local_c);
    if (MVar3 == EOned) {
      pztopology::TPZLine::GetTransformId(&in_stack_fffffffffffff570->super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff570 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff568);
    }
    else if (MVar3 == ETriangle) {
      pztopology::TPZTriangle::GetTransformId(in_stack_fffffffffffff598);
      pztopology::TPZTriangle::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff570 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff568);
    }
    else if (MVar3 == EQuadrilateral) {
      pztopology::TPZQuadrilateral::GetTransformId(in_stack_fffffffffffff5d8);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff580 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff578);
    }
    else {
      pzinternal::DebugStopImpl(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    }
    TPZManVector<int,_9>::TPZManVector
              ((TPZManVector<int,_9> *)in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
               (int *)in_stack_fffffffffffff590);
    iVar2 = pztopology::TPZQuadrilateral::SideDimension(0x1a07999);
    TPZFNMatrix<50,_double>::TPZFNMatrix
              (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
               (int64_t)in_stack_fffffffffffff580);
    TPZFNMatrix<50,_double>::TPZFNMatrix
              (in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
               (int64_t)in_stack_fffffffffffff580);
    pzshape::TPZShapeQuad::SideShape
              ((int)((ulong)in_stack_fffffffffffff590 >> 0x20),in_stack_fffffffffffff588,
               (TPZVec<long> *)in_stack_fffffffffffff580,(TPZVec<int> *)in_stack_fffffffffffff578,
               (TPZFMatrix<double> *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
    iVar4 = pztopology::TPZQuadrilateral::NContainedSides(0x1a07a2d);
    TPZManVector<long,_28>::TPZManVector
              (in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
               (long *)in_stack_fffffffffffff590);
    for (local_6cc = 0; local_6cc < iVar4; local_6cc = local_6cc + 1) {
      pztopology::TPZQuadrilateral::ContainedSideLocId
                ((int)in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      plVar7 = TPZVec<long>::operator[](local_6c0,(long)local_6cc);
      lVar8 = *plVar7;
      iVar5 = pzshape::TPZShapeQuad::NConnectShapeF
                        ((int)in_stack_fffffffffffff570,
                         (int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      lVar8 = lVar8 + iVar5;
      plVar7 = TPZVec<long>::operator[](local_6c0,(long)(local_6cc + 1));
      *plVar7 = lVar8;
    }
    local_6d8 = 1.0;
    TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff578);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffff580,in_stack_fffffffffffff578,
               (int)((ulong)in_stack_fffffffffffff570 >> 0x20));
    (**(code **)(*(long *)local_48 + 0x208))(local_48,local_c);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff590,
               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff590,
               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff590,
               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
    TPZGeoElSide::Jacobian
              ((TPZGeoElSide *)axes.fBuf[2],(TPZVec<double> *)axes.fBuf[1],
               (TPZFMatrix<double> *)axes.fBuf[0],
               (TPZFMatrix<double> *)axes.super_TPZFMatrix<double>.fWork.fNAlloc,
               (REAL *)axes.super_TPZFMatrix<double>.fWork.fNElements,
               (TPZFMatrix<double> *)axes.super_TPZFMatrix<double>.fWork.fStore);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a07ccc);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a07cd9);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1a07ce6);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1a07cf3);
    if (MVar3 == ETriangle) {
      local_6d8 = 0.16666666666666666;
    }
    for (local_99c = 0; local_99c < iVar4; local_99c = local_99c + 1) {
      TPZVec<long>::operator[](local_6c0,(long)local_99c);
      piVar9 = TPZVec<int>::operator[](local_110,(long)local_99c);
      TPZVec<long>::operator[](local_6c0,(long)*piVar9);
      plVar7 = TPZVec<long>::operator[](local_6c0,(long)(local_99c + 1));
      iVar5 = (int)*plVar7;
      plVar7 = TPZVec<long>::operator[](local_6c0,(long)local_99c);
      lVar8 = *plVar7;
      for (local_9ac = 0; local_9ac < iVar5 - (int)lVar8; local_9ac = local_9ac + 1) {
        in_stack_fffffffffffff590 =
             (TPZFNMatrix<50,_double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
        in_stack_fffffffffffff580 =
             (TPZGeoEl *)
             ((double)(in_stack_fffffffffffff590->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable / local_6d8);
        in_stack_fffffffffffff588 =
             (TPZVec<double> *)
             TPZFMatrix<double>::operator()
                       ((TPZFMatrix<double> *)in_stack_fffffffffffff590,
                        (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
        in_stack_fffffffffffff588->_vptr_TPZVec = (_func_int **)in_stack_fffffffffffff580;
        for (local_9b0 = 0; local_9b0 < iVar2; local_9b0 = local_9b0 + 1) {
          pdVar10 = TPZFMatrix<double>::operator()
                              (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                               (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580
                              );
          pp_Var11 = (_func_int **)(*pdVar10 / local_6d8);
          in_stack_fffffffffffff570 =
               (TPZManVector<long,_28> *)
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff590->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff588,(int64_t)in_stack_fffffffffffff580);
          (in_stack_fffffffffffff570->super_TPZVec<long>)._vptr_TPZVec = pp_Var11;
        }
      }
    }
    TPZManVector<long,_28>::~TPZManVector(in_stack_fffffffffffff570);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x1a08045);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x1a08052);
    TPZManVector<int,_9>::~TPZManVector((TPZManVector<int,_9> *)in_stack_fffffffffffff570);
    TPZManVector<int,_9>::~TPZManVector((TPZManVector<int,_9> *)in_stack_fffffffffffff570);
    TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffff570);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}